

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::MemoryType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
          *values,MemoryType *out,char *desc)

{
  MemoryType *this_00;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  const_reference pvVar4;
  int __c;
  Var *var_00;
  MemoryType local_98;
  Var local_80;
  char *local_38;
  char *desc_local;
  MemoryType *out_local;
  vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
  *values_local;
  Var *var_local;
  SharedValidator *this_local;
  Result result;
  
  local_38 = desc;
  desc_local = (char *)out;
  out_local = (MemoryType *)values;
  values_local = (vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
                  *)var;
  var_local = (Var *)this;
  Var::Var(&local_80,var);
  sVar2 = std::
          vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
          ::size((vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
                  *)out_local);
  var_00 = &local_80;
  this_local._4_4_ = CheckIndex(this,var_00,(Index)sVar2,local_38);
  Var::~Var(&local_80);
  if (desc_local != (char *)0x0) {
    bVar1 = Succeeded(this_local._4_4_);
    this_00 = out_local;
    if (bVar1) {
      pcVar3 = Var::index(var,(char *)var_00,__c);
      pvVar4 = std::
               vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
               ::operator[]((vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
                             *)this_00,(ulong)pcVar3 & 0xffffffff);
      local_98.limits.initial = (pvVar4->limits).initial;
      local_98.limits.max = (pvVar4->limits).max;
      local_98.limits.has_max = (pvVar4->limits).has_max;
      local_98.limits.is_shared = (pvVar4->limits).is_shared;
      local_98.limits.is_64 = (pvVar4->limits).is_64;
      local_98.limits._19_5_ = *(undefined5 *)&(pvVar4->limits).field_0x13;
    }
    else {
      memset(&local_98,0,0x18);
      MemoryType::MemoryType(&local_98);
    }
    *(uint64_t *)desc_local = local_98.limits.initial;
    *(uint64_t *)(desc_local + 8) = local_98.limits.max;
    desc_local[0x10] = local_98.limits.has_max;
    desc_local[0x11] = local_98.limits.is_shared;
    desc_local[0x12] = local_98.limits.is_64;
    desc_local[0x13] = local_98.limits._19_1_;
    desc_local[0x14] = local_98.limits._20_1_;
    desc_local[0x15] = local_98.limits._21_1_;
    desc_local[0x16] = local_98.limits._22_1_;
    desc_local[0x17] = local_98.limits._23_1_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}